

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O3

void __thiscall
cmCTestLaunchReporter::DumpFileToXML
          (cmCTestLaunchReporter *this,cmXMLElement *e3,char *tag,string *fname)

{
  pointer pRVar1;
  bool bVar2;
  RegularExpression *r;
  pointer pRVar3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  cmXMLElement e4;
  string line;
  char *sep;
  ifstream fin;
  cmXMLElement local_2b8;
  string local_2b0;
  char *local_290;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_288;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  undefined8 local_260;
  string local_258;
  istream local_238;
  
  std::ifstream::ifstream(&local_238,(fname->_M_dataplus)._M_p,_S_in|_S_bin);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  local_2b0._M_string_length = 0;
  local_2b0.field_2._M_local_buf[0] = '\0';
  local_290 = "";
  cmXMLElement::cmXMLElement(&local_2b8,e3,tag);
  do {
    do {
      bVar2 = cmsys::SystemTools::GetLineFromStream
                        (&local_238,&local_2b0,(bool *)0x0,0xffffffffffffffff);
      if (!bVar2) {
        cmXMLWriter::EndElement(local_2b8.xmlwr);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,
                          CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                                   local_2b0.field_2._M_local_buf[0]) + 1);
        }
        std::ifstream::~ifstream(&local_238);
        return;
      }
      bVar2 = MatchesFilterPrefix(this,&local_2b0);
    } while (bVar2);
    pRVar1 = (this->RegexWarningSuppress).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pRVar3 = (this->RegexWarningSuppress).
                  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                  ._M_impl.super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1)
    {
      bVar2 = cmsys::RegularExpression::find(pRVar3,local_2b0._M_dataplus._M_p,&pRVar3->regmatch);
      if (bVar2) {
        local_288.first._M_len = 0x1c;
        local_288.first._M_str = "[CTest: warning suppressed] ";
        local_288.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_270 = local_2b0._M_string_length;
        local_268 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0._M_dataplus._M_p;
        local_260 = 0;
        views._M_len = 2;
        views._M_array = &local_288;
        cmCatViews(&local_258,views);
        goto LAB_0028617a;
      }
    }
    pRVar3 = (this->RegexWarning).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar1 = (this->RegexWarning).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (pRVar3 == pRVar1) goto LAB_002861a1;
      bVar2 = cmsys::RegularExpression::find(pRVar3,local_2b0._M_dataplus._M_p,&pRVar3->regmatch);
      if (bVar2) break;
      pRVar3 = pRVar3 + 1;
    }
    local_288.first._M_len = 0x19;
    local_288.first._M_str = "[CTest: warning matched] ";
    local_288.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_270 = local_2b0._M_string_length;
    local_268 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p;
    local_260 = 0;
    views_00._M_len = 2;
    views_00._M_array = &local_288;
    cmCatViews(&local_258,views_00);
LAB_0028617a:
    std::__cxx11::string::operator=((string *)&local_2b0,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
LAB_002861a1:
    cmXMLWriter::Content<char_const*>(local_2b8.xmlwr,&local_290);
    cmXMLWriter::Content<std::__cxx11::string>(local_2b8.xmlwr,&local_2b0);
    local_290 = "\n";
  } while( true );
}

Assistant:

void cmCTestLaunchReporter::DumpFileToXML(cmXMLElement& e3, const char* tag,
                                          std::string const& fname)
{
  cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);

  std::string line;
  const char* sep = "";

  cmXMLElement e4(e3, tag);
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (this->MatchesFilterPrefix(line)) {
      continue;
    }
    if (this->Match(line, this->RegexWarningSuppress)) {
      line = cmStrCat("[CTest: warning suppressed] ", line);
    } else if (this->Match(line, this->RegexWarning)) {
      line = cmStrCat("[CTest: warning matched] ", line);
    }
    e4.Content(sep);
    e4.Content(line);
    sep = "\n";
  }
}